

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::write_macros_to_file_for_debug(CTcTokenizer *this,CVmFile *fp)

{
  CVmFile *in_RSI;
  long in_RDI;
  write_macro_ctx_t ctx;
  long endpos;
  long pos;
  CVmFile *in_stack_ffffffffffffffd0;
  CTcTokenizer *in_stack_ffffffffffffffe0;
  
  CVmFile::get_pos(in_stack_ffffffffffffffd0);
  CVmFile::write_uint4(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  enum_defines(in_stack_ffffffffffffffe0,(_func_void_void_ptr_CTcHashEntryPp_ptr *)0x0,in_RSI);
  CVmFile::get_pos(in_RSI);
  CVmFile::set_pos(in_RSI,in_RDI);
  CVmFile::write_uint4(in_RSI,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::set_pos(in_RSI,in_RDI);
  return;
}

Assistant:

void CTcTokenizer::write_macros_to_file_for_debug(CVmFile *fp)
{
    long pos;
    long endpos;
    write_macro_ctx_t ctx;

    /* write a placeholder for the symbol count */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* write the symbols */
    ctx.fp = fp;
    ctx.cnt = 0;
    enum_defines(&write_macros_cb, &ctx);

    /* go back and fix up the symbol count */
    endpos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to where we left off */
    fp->set_pos(endpos);
}